

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int CmdCommandHelp(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_30;
  int c;
  int fDetails;
  int fPrintAll;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  c = 0;
  local_30 = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"adh"), iVar1 != -1) {
    switch(iVar1) {
    case 0x61:
    case 0x76:
      c = c ^ 1;
      break;
    default:
      goto LAB_0032ec4f;
    case 100:
      local_30 = local_30 ^ 1;
      break;
    case 0x68:
      goto LAB_0032ec4f;
    }
  }
  if (argc == globalUtilOptind) {
    CmdCommandPrint(pAbc,c,local_30);
    pAbc_local._4_4_ = 0;
  }
  else {
LAB_0032ec4f:
    fprintf((FILE *)pAbc->Err,"usage: help [-a] [-d] [-h]\n");
    fprintf((FILE *)pAbc->Err,"       prints the list of available commands by group\n");
    pcVar2 = "no";
    if (c != 0) {
      pcVar2 = "yes";
    }
    fprintf((FILE *)pAbc->Err," -a       toggle printing hidden commands [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (local_30 != 0) {
      pcVar2 = "yes";
    }
    fprintf((FILE *)pAbc->Err," -d       print usage details to all commands [default = %s]\n",
            pcVar2);
    fprintf((FILE *)pAbc->Err," -h       print the command usage\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int CmdCommandHelp( Abc_Frame_t * pAbc, int argc, char **argv )
{
    int fPrintAll, fDetails;
    int c;

    fPrintAll = 0;
    fDetails = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "adh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            case 'v':
                fPrintAll ^= 1;
                break;
            break;
        case 'd':
            fDetails ^= 1;
            break;
        case 'h':
            goto usage;
            break;
        default:
            goto usage;
        }
    }

    if ( argc != globalUtilOptind )
        goto usage;

    CmdCommandPrint( pAbc, fPrintAll, fDetails );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: help [-a] [-d] [-h]\n" );
    fprintf( pAbc->Err, "       prints the list of available commands by group\n" );
    fprintf( pAbc->Err, " -a       toggle printing hidden commands [default = %s]\n", fPrintAll? "yes": "no" );
    fprintf( pAbc->Err, " -d       print usage details to all commands [default = %s]\n", fDetails? "yes": "no" );
    fprintf( pAbc->Err, " -h       print the command usage\n" );
    return 1;
}